

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeModuleDestroy(ze_module_handle_t hModule)

{
  ze_pfnModuleDestroy_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnModuleDestroy_t pfnDestroy;
  ze_module_handle_t hModule_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Module).pfnDestroy;
    if (p_Var1 == (ze_pfnModuleDestroy_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hModule_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hModule_local._4_4_ = (*p_Var1)(hModule);
    }
  }
  else {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hModule_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeModuleDestroy(
    ze_module_handle_t hModule                      ///< [in][release] handle of the module
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnModuleDestroy_t pfnDestroy = [&result] {
        auto pfnDestroy = ze_lib::context->zeDdiTable.load()->Module.pfnDestroy;
        if( nullptr == pfnDestroy ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnDestroy;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnDestroy( hModule );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnDestroy = ze_lib::context->zeDdiTable.load()->Module.pfnDestroy;
    if( nullptr == pfnDestroy ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnDestroy( hModule );
    #endif
}